

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArray.H
# Opt level: O0

void __thiscall
amrex::FabArray<amrex::TagBox>::define
          (FabArray<amrex::TagBox> *this,BoxArray *bxs,DistributionMapping *dm,int nvar,
          IntVect *ngrow,MFInfo *info,FabFactory<amrex::TagBox> *a_factory)

{
  undefined4 in_ECX;
  long in_RDI;
  FabArrayBase *in_R9;
  long *in_stack_00000008;
  Arena *default_arena;
  unique_ptr<amrex::FabFactory<amrex::TagBox>,_std::default_delete<amrex::FabFactory<amrex::TagBox>_>_>
  factory;
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000068;
  FabFactory<amrex::TagBox> *in_stack_00000078;
  FabArray<amrex::TagBox> *in_stack_00000080;
  unique_ptr<amrex::FabFactory<amrex::TagBox>,_std::default_delete<amrex::FabFactory<amrex::TagBox>_>_>
  *in_stack_ffffffffffffff98;
  unique_ptr<amrex::FabFactory<amrex::TagBox>,_std::default_delete<amrex::FabFactory<amrex::TagBox>_>_>
  *in_stack_ffffffffffffffa0;
  DistributionMapping *this_00;
  FabArrayBase *in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffbc;
  DistributionMapping *dm_00;
  BoxArray *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffe0;
  
  (**(code **)(*in_stack_00000008 + 0x28))();
  std::
  unique_ptr<amrex::FabFactory<amrex::TagBox>,std::default_delete<amrex::FabFactory<amrex::TagBox>>>
  ::unique_ptr<std::default_delete<amrex::FabFactory<amrex::TagBox>>,void>
            (in_stack_ffffffffffffffa0,(pointer)in_stack_ffffffffffffff98);
  dm_00 = *(DistributionMapping **)(in_RDI + 0xf8);
  clear((FabArray<amrex::TagBox> *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0));
  std::
  unique_ptr<amrex::FabFactory<amrex::TagBox>,_std::default_delete<amrex::FabFactory<amrex::TagBox>_>_>
  ::operator=(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  this_00 = dm_00;
  if (*(long *)&(in_R9->boxarray).m_bat != 0) {
    this_00 = *(DistributionMapping **)&(in_R9->boxarray).m_bat;
  }
  *(DistributionMapping **)(in_RDI + 0xf8) = this_00;
  *(undefined1 *)(in_RDI + 0x100) = 1;
  FabArrayBase::define
            (in_R9,in_stack_ffffffffffffffc8,dm_00,in_stack_ffffffffffffffbc,
             (IntVect *)in_stack_ffffffffffffffb0);
  FabArrayBase::addThisBD(in_stack_ffffffffffffffb0);
  if (((ulong)in_R9->_vptr_FabArrayBase & 1) != 0) {
    std::
    unique_ptr<amrex::FabFactory<amrex::TagBox>,_std::default_delete<amrex::FabFactory<amrex::TagBox>_>_>
    ::operator*((unique_ptr<amrex::FabFactory<amrex::TagBox>,_std::default_delete<amrex::FabFactory<amrex::TagBox>_>_>
                 *)this_00);
    AllocFabs(in_stack_00000080,in_stack_00000078,(Arena *)a_factory,in_stack_00000068);
    Gpu::streamSynchronizeAll();
  }
  std::
  unique_ptr<amrex::FabFactory<amrex::TagBox>,_std::default_delete<amrex::FabFactory<amrex::TagBox>_>_>
  ::~unique_ptr((unique_ptr<amrex::FabFactory<amrex::TagBox>,_std::default_delete<amrex::FabFactory<amrex::TagBox>_>_>
                 *)this_00);
  return;
}

Assistant:

void
FabArray<FAB>::define (const BoxArray&            bxs,
                       const DistributionMapping& dm,
                       int                        nvar,
                       const IntVect&             ngrow,
                       const MFInfo&              info,
                       const FabFactory<FAB>&     a_factory)
{
    std::unique_ptr<FabFactory<FAB> > factory(a_factory.clone());

    auto default_arena = m_dallocator.m_arena;
    clear();

    m_factory = std::move(factory);
    m_dallocator.m_arena = info.arena ? info.arena : default_arena;

    define_function_called = true;

    BL_ASSERT(ngrow.allGE(IntVect::TheZeroVector()));
    BL_ASSERT(boxarray.size() == 0);
    FabArrayBase::define(bxs, dm, nvar, ngrow);

    addThisBD();

    if(info.alloc) {
        AllocFabs(*m_factory, m_dallocator.m_arena, info.tags);
        Gpu::streamSynchronizeAll();
#ifdef BL_USE_TEAM
        ParallelDescriptor::MyTeam().MemoryBarrier();
#endif
    }
}